

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcAdjacencyInfo.h
# Opt level: O1

O3DGCErrorCode __thiscall o3dgc::AdjacencyInfo::AllocateNeighborsArray(AdjacencyInfo *this)

{
  ulong uVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  
  lVar4 = this->m_numElements;
  if (1 < lVar4) {
    lVar2 = 1;
    do {
      plVar3 = this->m_numNeighbors + lVar2;
      *plVar3 = *plVar3 + this->m_numNeighbors[lVar2 + -1];
      lVar2 = lVar2 + 1;
      lVar4 = this->m_numElements;
    } while (lVar2 < lVar4);
  }
  if (this->m_neighborsSize < this->m_numNeighbors[lVar4 + -1]) {
    if (this->m_neighbors != (long *)0x0) {
      operator_delete__(this->m_neighbors);
    }
    uVar1 = this->m_numNeighbors[this->m_numElements + -1];
    this->m_neighborsSize = uVar1;
    plVar3 = (long *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3);
    this->m_neighbors = plVar3;
  }
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode          AllocateNeighborsArray()
                                {
                                    for(long i = 1; i < m_numElements; ++i)
                                    {
                                        m_numNeighbors[i] += m_numNeighbors[i-1];
                                    }
                                    if (m_numNeighbors[m_numElements-1] > m_neighborsSize)
                                    {
                                        delete [] m_neighbors;
                                        m_neighborsSize = m_numNeighbors[m_numElements-1];
                                        m_neighbors = new long [m_neighborsSize];
                                    }
                                    return O3DGC_OK;
                                }